

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  unsigned_long_long uVar4;
  void *src_00;
  ulong uVar5;
  bool bVar6;
  ZSTD_frameSizeInfo ZVar7;
  size_t sStack_70;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    uVar1 = (ulong)*(uint *)((long)src + 4) + 8;
    uVar5 = 0xffffffffffffffb8;
    if (uVar1 <= srcSize) {
      uVar5 = uVar1;
    }
    uVar1 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      uVar1 = uVar5;
    }
    if (srcSize < uVar1 && uVar1 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5b7a,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
    }
    uVar4 = 0;
    goto LAB_0014c3ea;
  }
  uVar1 = ZSTD_getFrameHeader(&zfh,src,srcSize);
  uVar4 = 0xfffffffffffffffe;
  if (0xffffffffffffff88 < uVar1) goto LAB_0014c3ea;
  if (uVar1 == 0) {
    src_00 = (void *)((long)src + (ulong)zfh.headerSize);
    uVar5 = srcSize - zfh.headerSize;
    lVar3 = 0;
    sStack_70 = 0xffffffffffffffb8;
    do {
      uVar1 = ZSTD_getcBlockSize(src_00,uVar5,&blockProperties);
      if (0xffffffffffffff88 < uVar1) goto LAB_0014c3ea;
      uVar2 = uVar1 + 3;
      bVar6 = uVar5 < uVar2;
      uVar5 = uVar5 - uVar2;
      uVar1 = sStack_70;
      if (bVar6) goto LAB_0014c3ea;
      src_00 = (void *)((long)src_00 + uVar2);
      lVar3 = lVar3 + 1;
    } while (blockProperties.lastBlock == 0);
    if (zfh.checksumFlag != 0) {
      if (uVar5 < 4) goto LAB_0014c3e6;
      src_00 = (void *)((long)src_00 + 4);
    }
    uVar1 = (long)src_00 - (long)src;
    uVar4 = lVar3 * (ulong)zfh.blockSizeMax;
    if (zfh.frameContentSize != 0xffffffffffffffff) {
      uVar4 = zfh.frameContentSize;
    }
  }
  else {
LAB_0014c3e6:
    uVar1 = 0xffffffffffffffb8;
  }
LAB_0014c3ea:
  ZVar7.decompressedBound = uVar4;
  ZVar7.compressedSize = uVar1;
  return ZVar7;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = ip - ipstart;
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}